

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O2

PHYSFS_Io * UNPK_duplicate(PHYSFS_Io *_io)

{
  long *plVar1;
  undefined4 uVar2;
  PHYSFS_Io *pPVar3;
  long *plVar4;
  long lVar5;
  PHYSFS_Io *pPVar6;
  byte bVar7;
  
  bVar7 = 0;
  plVar1 = (long *)_io->opaque;
  pPVar3 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
  plVar4 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(0x18);
  if (pPVar3 == (PHYSFS_Io *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    if (plVar4 == (long *)0x0) {
      return (PHYSFS_Io *)0x0;
    }
  }
  else {
    if (plVar4 == (long *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      goto LAB_0010c592;
    }
    lVar5 = (**(code **)(*plVar1 + 0x38))();
    if (lVar5 != 0) {
      *plVar4 = lVar5;
      plVar4[1] = plVar1[1];
      *(undefined4 *)(plVar4 + 2) = 0;
      pPVar6 = pPVar3;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        uVar2 = *(undefined4 *)&_io->field_0x4;
        pPVar6->version = _io->version;
        *(undefined4 *)&pPVar6->field_0x4 = uVar2;
        _io = (PHYSFS_Io *)((long)_io + (ulong)bVar7 * -0x10 + 8);
        pPVar6 = (PHYSFS_Io *)((long)pPVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      pPVar3->opaque = plVar4;
      return pPVar3;
    }
  }
  (*__PHYSFS_AllocatorHooks.Free)(plVar4);
  if (pPVar3 == (PHYSFS_Io *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
LAB_0010c592:
  (*__PHYSFS_AllocatorHooks.Free)(pPVar3);
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *UNPK_duplicate(PHYSFS_Io *_io)
{
    UNPKfileinfo *origfinfo = (UNPKfileinfo *) _io->opaque;
    PHYSFS_Io *io = NULL;
    PHYSFS_Io *retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    UNPKfileinfo *finfo = (UNPKfileinfo *) allocator.Malloc(sizeof (UNPKfileinfo));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, UNPK_duplicate_failed);
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, UNPK_duplicate_failed);

    io = origfinfo->io->duplicate(origfinfo->io);
    if (!io) goto UNPK_duplicate_failed;
    finfo->io = io;
    finfo->entry = origfinfo->entry;
    finfo->curPos = 0;
    memcpy(retval, _io, sizeof (PHYSFS_Io));
    retval->opaque = finfo;
    return retval;

UNPK_duplicate_failed:
    if (finfo != NULL) allocator.Free(finfo);
    if (retval != NULL) allocator.Free(retval);
    if (io != NULL) io->destroy(io);
    return NULL;
}